

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportBuildFileGenerator::ComplainAboutMissingTarget
          (cmExportBuildFileGenerator *this,cmGeneratorTarget *depender,cmGeneratorTarget *dependee,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *exportFiles)

{
  cmake *this_00;
  string *psVar1;
  ostream *poVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  string_view separator;
  ostringstream e;
  string local_1d0;
  cmListFileBacktrace local_1b0;
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"export called with target \"",0x1b);
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(depender);
  poVar3 = (ostream *)local_1a0;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" which requires target \"",0x19);
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
  if ((exportFiles->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (exportFiles->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    lVar4 = 0x1e;
    pcVar5 = "that is not in any export set.";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "that is not in this export set, but in multiple other export sets: ",0x43);
    separator._M_str = ", ";
    separator._M_len = 2;
    cmJoin(&local_1d0,exportFiles,separator,(string_view)ZEXT816(0));
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "An exported target cannot depend upon another target which is exported multiple times. Consider consolidating the exports of the \""
               ,0x82);
    psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    lVar4 = 0x1c;
    pcVar5 = "\" target to a single export.";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  this_00 = this->LG->GlobalGenerator->CMakeInstance;
  std::__cxx11::stringbuf::str();
  cmMakefile::GetBacktrace(this->LG->Makefile);
  cmake::IssueMessage(this_00,FATAL_ERROR,&local_1d0,&local_1b0);
  if (local_1b0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return;
}

Assistant:

void cmExportBuildFileGenerator::ComplainAboutMissingTarget(
  cmGeneratorTarget const* depender, cmGeneratorTarget const* dependee,
  std::vector<std::string> const& exportFiles)
{
  std::ostringstream e;
  e << "export called with target \"" << depender->GetName()
    << "\" which requires target \"" << dependee->GetName() << "\" ";
  if (exportFiles.empty()) {
    e << "that is not in any export set.";
  } else {
    e << "that is not in this export set, but in multiple other export sets: "
      << cmJoin(exportFiles, ", ") << ".\n";
    e << "An exported target cannot depend upon another target which is "
         "exported multiple times. Consider consolidating the exports of the "
         "\""
      << dependee->GetName() << "\" target to a single export.";
  }

  this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, e.str(),
    this->LG->GetMakefile()->GetBacktrace());
}